

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testRunEnded
          (StreamingReporterBase<Catch::CompactReporter> *this,TestRunStats *param_2)

{
  LazyStat<Catch::TestCaseInfo> *in_RSI;
  
  LazyStat<Catch::TestCaseInfo>::reset(in_RSI);
  LazyStat<Catch::GroupInfo>::reset((LazyStat<Catch::GroupInfo> *)in_RSI);
  LazyStat<Catch::TestRunInfo>::reset((LazyStat<Catch::TestRunInfo> *)in_RSI);
  return;
}

Assistant:

void testRunEnded(TestRunStats const& /* _testRunStats */) override {
            currentTestCaseInfo.reset();
            currentGroupInfo.reset();
            currentTestRunInfo.reset();
        }